

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

QPointF __thiscall
QGraphicsProxyWidgetPrivate::mapToReceiver
          (QGraphicsProxyWidgetPrivate *this,QPointF *pos,QWidget *receiver)

{
  Data *pDVar1;
  QWidget *pQVar2;
  QPoint QVar3;
  QPointF QVar4;
  double local_28;
  double dStack_20;
  
  QVar4 = *pos;
  if (receiver != (QWidget *)0x0) {
    do {
      pDVar1 = (this->widget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar2 = (QWidget *)0x0;
      }
      else {
        pQVar2 = (QWidget *)(this->widget).wp.value;
      }
      if (pQVar2 == receiver) {
        return QVar4;
      }
      QVar3 = QWidget::pos(receiver);
      local_28 = QVar4.xp;
      dStack_20 = QVar4.yp;
      dStack_20 = dStack_20 - (double)QVar3.yp.m_i.m_i;
      QVar4.yp._0_4_ = SUB84(dStack_20,0);
      QVar4.xp = local_28 - (double)QVar3.xp.m_i.m_i;
      QVar4.yp._4_4_ = (int)((ulong)dStack_20 >> 0x20);
      receiver = *(QWidget **)(*(long *)&receiver->field_0x8 + 0x10);
    } while (receiver != (QWidget *)0x0);
  }
  return QVar4;
}

Assistant:

QPointF QGraphicsProxyWidgetPrivate::mapToReceiver(const QPointF &pos, const QWidget *receiver) const
{
    QPointF p = pos;
    // Map event position from us to the receiver, preserving its
    // precision (don't use QWidget::mapFrom here).
    while (receiver && receiver != widget) {
        p -= QPointF(receiver->pos());
        receiver = receiver->parentWidget();
    }
    return p;
}